

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

bool __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextureStore
          (ConversionStream *this,iterator *Token,iterator *ScopeEnd,Uint32 ArrayDim)

{
  bool bVar1;
  bool bVar2;
  pointer pHVar3;
  Char *Message;
  char *pcVar4;
  char (*Args_1) [60];
  allocator local_659;
  string local_658;
  allocator local_631;
  string local_630;
  HLSLTokenInfo local_610;
  const_iterator local_5c0;
  _List_node_base *local_5b8;
  allocator local_5a9;
  string local_5a8;
  allocator local_581;
  string local_580;
  HLSLTokenInfo local_560;
  const_iterator local_510;
  _List_node_base *local_508;
  allocator local_4f9;
  string local_4f8;
  allocator local_4d1;
  string local_4d0;
  HLSLTokenInfo local_4b0;
  const_iterator local_460;
  _List_node_base *local_458;
  allocator local_449;
  string local_448;
  allocator local_421;
  string local_420;
  HLSLTokenInfo local_400;
  const_iterator local_3b0;
  _List_node_base *local_3a8;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  HLSLTokenInfo local_350;
  const_iterator local_300;
  _List_node_base *local_2f8;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  HLSLTokenInfo local_2a0;
  const_iterator local_250;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_248;
  iterator LocationToken;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  HLSLTokenInfo local_1e8;
  const_iterator local_198;
  _List_node_base *local_190;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  HLSLTokenInfo local_138;
  const_iterator local_e8;
  _Self local_e0;
  iterator SemicolonToken;
  iterator AssignmentToken;
  string msg;
  String local_a0;
  undefined1 local_80 [8];
  string err;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_58;
  _List_node_base *local_50;
  uint local_44;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Stack_40;
  Uint32 ArrayIdx;
  iterator ClosingStapleToken;
  iterator OpenStapleToken;
  Uint32 ArrayDim_local;
  iterator *ScopeEnd_local;
  iterator *Token_local;
  ConversionStream *this_local;
  
  ClosingStapleToken = (iterator)Token->_M_node;
  _Stack_40._M_node = ScopeEnd->_M_node;
  local_44 = 0;
  while( true ) {
    Args_1 = (char (*) [60])(ulong)(ArrayDim + 1);
    if (ArrayDim + 1 <= local_44) {
      SemicolonToken._M_node = _Stack_40._M_node;
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&SemicolonToken);
      bVar1 = std::operator==(&SemicolonToken,ScopeEnd);
      if ((bVar1) ||
         (pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             (&SemicolonToken), pHVar3->Type != Assignment)) {
        this_local._7_1_ = false;
      }
      else {
        local_e0._M_node = SemicolonToken._M_node;
        while( true ) {
          bVar2 = std::operator!=(&local_e0,ScopeEnd);
          bVar1 = false;
          if (bVar2) {
            pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_e0);
            bVar1 = pHVar3->Type != Semicolon;
          }
          if (!bVar1) break;
          std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_e0);
        }
        bVar1 = std::operator==(&local_e0,ScopeEnd);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                    (&local_e8,Token);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_158,"imageStore",&local_159);
          std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_180,pcVar4,&local_181);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    (&local_138,Identifier,&local_158,&local_180,0xffffffffffffffff);
          local_190 = (_List_node_base *)
                      std::__cxx11::
                      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                      ::insert(&this->m_Tokens,local_e8,&local_138);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_138);
          std::__cxx11::string::~string((string *)&local_180);
          std::allocator<char>::~allocator((allocator<char> *)&local_181);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator((allocator<char> *)&local_159);
          std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                    (&local_198,Token);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_208,"(",&local_209);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_230,"",&local_231);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    (&local_1e8,OpenParen,&local_208,&local_230,0xffffffffffffffff);
          LocationToken =
               std::__cxx11::
               list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
               ::insert(&this->m_Tokens,local_198,&local_1e8);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_1e8);
          std::__cxx11::string::~string((string *)&local_230);
          std::allocator<char>::~allocator((allocator<char> *)&local_231);
          std::__cxx11::string::~string((string *)&local_208);
          std::allocator<char>::~allocator((allocator<char> *)&local_209);
          pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
          std::__cxx11::string::operator=((string *)&pHVar3->Delimiter," ");
          pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             (&ClosingStapleToken);
          std::__cxx11::string::operator=((string *)&pHVar3->Delimiter,"");
          pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             (&ClosingStapleToken);
          pHVar3->Type = Comma;
          pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             (&ClosingStapleToken);
          std::__cxx11::string::operator=((string *)&pHVar3->Literal,",");
          local_248._M_node = ClosingStapleToken._M_node;
          std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_248);
          std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                    (&local_250,&local_248);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2c0,"_ToIvec",&local_2c1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2e8," ",&local_2e9);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    (&local_2a0,Identifier,&local_2c0,&local_2e8,0xffffffffffffffff);
          local_2f8 = (_List_node_base *)
                      std::__cxx11::
                      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                      ::insert(&this->m_Tokens,local_250,&local_2a0);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_2a0);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
          std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                    (&local_300,&local_248);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_370,"(",&local_371);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_398,"",&local_399);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    (&local_350,OpenParen,&local_370,&local_398,0xffffffffffffffff);
          local_3a8 = (_List_node_base *)
                      std::__cxx11::
                      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                      ::insert(&this->m_Tokens,local_300,&local_350);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_350);
          std::__cxx11::string::~string((string *)&local_398);
          std::allocator<char>::~allocator((allocator<char> *)&local_399);
          std::__cxx11::string::~string((string *)&local_370);
          std::allocator<char>::~allocator((allocator<char> *)&local_371);
          std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                    (&local_3b0,&stack0xffffffffffffffc0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_420,")",&local_421);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_448,"",&local_449);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    (&local_400,ClosingParen,&local_420,&local_448,0xffffffffffffffff);
          local_458 = (_List_node_base *)
                      std::__cxx11::
                      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                      ::insert(&this->m_Tokens,local_3b0,&local_400);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_400);
          std::__cxx11::string::~string((string *)&local_448);
          std::allocator<char>::~allocator((allocator<char> *)&local_449);
          std::__cxx11::string::~string((string *)&local_420);
          std::allocator<char>::~allocator((allocator<char> *)&local_421);
          pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             (&stack0xffffffffffffffc0);
          std::__cxx11::string::operator=((string *)&pHVar3->Delimiter,"");
          pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             (&stack0xffffffffffffffc0);
          pHVar3->Type = Comma;
          pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             (&stack0xffffffffffffffc0);
          std::__cxx11::string::operator=((string *)&pHVar3->Literal,",");
          pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             (&SemicolonToken);
          std::__cxx11::string::operator=((string *)&pHVar3->Delimiter,"");
          pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             (&SemicolonToken);
          pHVar3->Type = OpenParen;
          pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             (&SemicolonToken);
          std::__cxx11::string::operator=((string *)&pHVar3->Literal,"(");
          std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                    (&local_460,&SemicolonToken);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_4d0,"_ExpandVector",&local_4d1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_4f8," ",&local_4f9);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    (&local_4b0,Identifier,&local_4d0,&local_4f8,0xffffffffffffffff);
          local_508 = (_List_node_base *)
                      std::__cxx11::
                      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                      ::insert(&this->m_Tokens,local_460,&local_4b0);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_4b0);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
          std::__cxx11::string::~string((string *)&local_4d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
          std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                    (&local_510,&local_e0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_580,")",&local_581);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_5a8,"",&local_5a9);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    (&local_560,ClosingParen,&local_580,&local_5a8,0xffffffffffffffff);
          local_5b8 = (_List_node_base *)
                      std::__cxx11::
                      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                      ::insert(&this->m_Tokens,local_510,&local_560);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_560);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
          std::__cxx11::string::~string((string *)&local_580);
          std::allocator<char>::~allocator((allocator<char> *)&local_581);
          std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                    (&local_5c0,&local_e0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_630,")",&local_631);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_658,"",&local_659);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    (&local_610,ClosingParen,&local_630,&local_658,0xffffffffffffffff);
          std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::insert(&this->m_Tokens,local_5c0,&local_610);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_610);
          std::__cxx11::string::~string((string *)&local_658);
          std::allocator<char>::~allocator((allocator<char> *)&local_659);
          std::__cxx11::string::~string((string *)&local_630);
          std::allocator<char>::~allocator((allocator<char> *)&local_631);
          Token->_M_node = local_248._M_node;
          this_local._7_1_ = true;
        }
      }
      return this_local._7_1_;
    }
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&ClosingStapleToken);
    bVar1 = std::operator==(&ClosingStapleToken,ScopeEnd);
    if ((bVar1) ||
       (pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                           (&ClosingStapleToken), pHVar3->Type != OpenSquareBracket)) break;
    local_58._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         begin(&this->m_Tokens);
    err.field_2._8_8_ = ClosingStapleToken._M_node;
    local_50 = (_List_node_base *)
               Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                         (&local_58,ScopeEnd,ClosingStapleToken._M_node);
    _Stack_40 = (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)local_50;
    bVar1 = std::operator!=(Token,ScopeEnd);
    if (!bVar1) {
      FormatString<char[48]>
                ((string *)local_80,(char (*) [48])"Unable to find matching closing square bracket."
                );
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_a0,this,Token,4);
      Args_1 = (char (*) [60])0x7bc;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessRWTextureStore",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x7bc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_80,(char (*) [2])0xe6c869,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)local_80);
    }
    pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                       (&stack0xffffffffffffffc0);
    if (pHVar3->Type != ClosingSquareBracket) {
      FormatString<char[26],char[60]>
                ((string *)&AssignmentToken,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"ClosingStapleToken->Type == TokenType::ClosingSquareBracket",Args_1
                );
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"ProcessRWTextureStore",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x7c1);
      std::__cxx11::string::~string((string *)&AssignmentToken);
    }
    if (local_44 < ArrayDim) {
      ClosingStapleToken._M_node = _Stack_40._M_node;
    }
    local_44 = local_44 + 1;
  }
  return false;
}

Assistant:

bool HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextureStore(TokenListType::iterator&       Token,
                                                                     const TokenListType::iterator& ScopeEnd,
                                                                     Uint32                         ArrayDim)
{
    // RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    // ^

    // Find the last pair of square brackets, skipping texture array indexing
    auto OpenStapleToken    = Token;
    auto ClosingStapleToken = ScopeEnd;
    for (Uint32 ArrayIdx = 0; ArrayIdx < ArrayDim + 1; ++ArrayIdx)
    {
        ++OpenStapleToken;
        if (OpenStapleToken == ScopeEnd || OpenStapleToken->Type != TokenType::OpenSquareBracket)
            return false;

        ClosingStapleToken = Parsing::FindMatchingBracket(m_Tokens.begin(), ScopeEnd, OpenStapleToken);
        VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unable to find matching closing square bracket.");

        // RWTex[Location[idx].xy]
        //                       ^
        //              ClosingStapleToken
        VERIFY_EXPR(ClosingStapleToken->Type == TokenType::ClosingSquareBracket);

        if (ArrayIdx < ArrayDim)
        {
            OpenStapleToken = ClosingStapleToken;
            // RWTexArray[idx[0]][Location.xy]
            //                  ^
            //            OpenStapleToken
        }
    }
    //      RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //           ^           ^
    //  OpenStaplePos     ClosingStaplePos

    auto AssignmentToken = ClosingStapleToken;
    ++AssignmentToken;

    if (AssignmentToken == ScopeEnd || AssignmentToken->Type != TokenType::Assignment)
    {
        // The function is called for ALL RW texture objects found, so this may not be
        // the store operation, but something else (for instance:
        // InterlockedExchange(Tex2D_I1[GTid.xy], 1, iOldVal) )
        return false;
    }

    // RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //                    ^
    //              AssignmentToken

    auto SemicolonToken = AssignmentToken;
    while (SemicolonToken != ScopeEnd && SemicolonToken->Type != TokenType::Semicolon)
        ++SemicolonToken;
    if (SemicolonToken == ScopeEnd)
        return false;
    // RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    // ^                                              ^
    // Token                                    SemicolonToken

    m_Tokens.insert(Token, TokenInfo(TokenType::Identifier, "imageStore", Token->Delimiter.c_str()));
    m_Tokens.insert(Token, TokenInfo(TokenType::OpenParen, "(", ""));
    Token->Delimiter = " ";
    // imageStore( RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //             ^    ^
    //          Token  OpenStapleToken

    OpenStapleToken->Delimiter = "";
    OpenStapleToken->Type      = TokenType::Comma;
    OpenStapleToken->Literal   = ",";
    // imageStore( RWTex,Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //                  ^           ^
    //      OpenStapleToken     ClosingStapleToken

    auto LocationToken = OpenStapleToken;
    ++LocationToken;
    m_Tokens.insert(LocationToken, TokenInfo(TokenType::Identifier, "_ToIvec", " "));
    m_Tokens.insert(LocationToken, TokenInfo(TokenType::OpenParen, "(", ""));
    // imageStore( RWTex, _ToIvec(Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //                            ^          ^
    //                  LocationToken     ClosingStapleToken

    m_Tokens.insert(ClosingStapleToken, TokenInfo(TokenType::ClosingParen, ")", ""));
    // imageStore( RWTex, _ToIvec(Location.xy)] = float4(0.0, 0.0, 0.0, 1.0);
    //                                        ^
    //                                ClosingStapleToken

    ClosingStapleToken->Delimiter = "";
    ClosingStapleToken->Type      = TokenType::Comma;
    ClosingStapleToken->Literal   = ",";
    // imageStore( RWTex, _ToIvec(Location.xy), = float4(0.0, 0.0, 0.0, 1.0);
    //                                          ^
    //                                   AssignmentToken

    AssignmentToken->Delimiter = "";
    AssignmentToken->Type      = TokenType::OpenParen;
    AssignmentToken->Literal   = "(";
    // imageStore( RWTex, _ToIvec(Location.xy),( float4(0.0, 0.0, 0.0, 1.0);
    //                                         ^
    //                                   AssignmentToken

    m_Tokens.insert(AssignmentToken, TokenInfo(TokenType::Identifier, "_ExpandVector", " "));
    // imageStore( RWTex, _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0);
    //                                                       ^                           ^
    //                                                AssignmentToken               SemicolonToken

    // Insert closing bracket for _ExpandVector
    m_Tokens.insert(SemicolonToken, TokenInfo(TokenType::ClosingParen, ")", ""));
    // imageStore( RWTex,  _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0));
    //                                                                                     ^
    //                                                                              SemicolonToken

    // Insert closing bracket for imageStore
    m_Tokens.insert(SemicolonToken, TokenInfo(TokenType::ClosingParen, ")", ""));
    // imageStore( RWTex,  _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0)));
    //                                                                                      ^
    //                                                                               SemicolonToken

    Token = LocationToken;
    // imageStore( RWTex,  _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0)));
    //                             ^

    // Note that 'Location' may require further processing as it itself may be e.g. image load operation

    return true;
}